

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_packet.c
# Opt level: O0

void cycle(uint64_t error,int start,int depth,uint64_t codeword)

{
  ulong error_00;
  uint64_t syndrome_00;
  undefined4 local_3c;
  int i;
  uint64_t base;
  uint64_t syndrome;
  uint64_t new_error;
  uint64_t codeword_local;
  int depth_local;
  int start_local;
  uint64_t error_local;
  
  for (local_3c = start; local_3c < 0x3a; local_3c = local_3c + 1) {
    error_00 = error | 1L << ((byte)local_3c & 0x3f);
    if (depth + -1 == 0) {
      syndrome_00 = gen_syndrome(codeword ^ error_00);
      add_syndrome(syndrome_00,error_00);
    }
    else {
      cycle(error_00,local_3c + 1,depth + -1,codeword);
    }
  }
  return;
}

Assistant:

static void cycle(uint64_t error, int start, int depth, uint64_t codeword)
{
	uint64_t new_error, syndrome, base;
	int i;
	base = 1;
	depth -= 1;
	for (i = start; i < 58; i++)
	{
		new_error = (base << i);
		new_error |= error;
		if (depth)
			cycle(new_error, i + 1, depth, codeword);
		else {
			syndrome = gen_syndrome(codeword ^ new_error);
			add_syndrome(syndrome, new_error);
		}
	}
}